

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_3x3(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                  JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  JSAMPLE *pJVar3;
  void *pvVar4;
  JSAMPROW pJVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int aiStack_38 [4];
  int workspace [9];
  
  pJVar3 = cinfo->sample_range_limit;
  pvVar4 = compptr->dct_table;
  lVar8 = 0;
  do {
    lVar12 = (long)*(short *)((long)pvVar4 + lVar8 * 2) * (long)coef_block[lVar8] * 0x2000;
    lVar7 = (long)*(short *)((long)pvVar4 + lVar8 * 2 + 0x20) * (long)coef_block[lVar8 + 0x10];
    lVar10 = lVar7 * 0x16a1 + lVar12 + 0x400;
    lVar13 = (long)*(short *)((long)pvVar4 + lVar8 * 2 + 0x10) * (long)coef_block[lVar8 + 8];
    aiStack_38[lVar8] = (int)((ulong)(lVar10 + lVar13 * 0x2731) >> 0xb);
    workspace[lVar8 + 2] = (int)((ulong)(lVar10 + lVar13 * -0x2731) >> 0xb);
    workspace[lVar8 + -1] = (int)(lVar12 + lVar7 * 0x7ffffffd2be + 0x400U >> 0xb);
    lVar8 = lVar8 + 1;
  } while ((int)lVar8 != 3);
  uVar6 = (ulong)output_col;
  lVar8 = 0;
  do {
    pJVar5 = *output_buf;
    iVar1 = *(int *)((long)aiStack_38 + lVar8 + 8);
    iVar9 = *(int *)((long)aiStack_38 + lVar8) * 0x2000;
    iVar11 = iVar1 * 0x16a1 + iVar9 + 0x20000;
    iVar2 = *(int *)((long)aiStack_38 + lVar8 + 4);
    pJVar5[uVar6] = pJVar3[(ulong)((uint)(iVar11 + iVar2 * 0x2731) >> 0x12 & 0x3ff) + 0x80];
    pJVar5[uVar6 + 2] = pJVar3[(ulong)((uint)(iVar11 + iVar2 * -0x2731) >> 0x12 & 0x3ff) + 0x80];
    pJVar5[uVar6 + 1] = pJVar3[(ulong)(iVar9 + iVar1 * 0xfffd2be + 0x20000U >> 0x12 & 0x3ff) + 0x80]
    ;
    output_buf = output_buf + 1;
    lVar8 = lVar8 + 0xc;
  } while (lVar8 != 0x24);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_3x3(j_decompress_ptr cinfo, jpeg_component_info *compptr,
              JCOEFPTR coef_block, JSAMPARRAY output_buf,
              JDIMENSION output_col)
{
  JLONG tmp0, tmp2, tmp10, tmp12;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[3 * 3];         /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 3; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp0 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS - PASS1_BITS - 1);
    tmp2 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    tmp12 = MULTIPLY(tmp2, FIX(0.707106781)); /* c2 */
    tmp10 = tmp0 + tmp12;
    tmp2 = tmp0 - tmp12 - tmp12;

    /* Odd part */

    tmp12 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    tmp0 = MULTIPLY(tmp12, FIX(1.224744871)); /* c1 */

    /* Final output stage */

    wsptr[3 * 0] = (int)RIGHT_SHIFT(tmp10 + tmp0, CONST_BITS - PASS1_BITS);
    wsptr[3 * 2] = (int)RIGHT_SHIFT(tmp10 - tmp0, CONST_BITS - PASS1_BITS);
    wsptr[3 * 1] = (int)RIGHT_SHIFT(tmp2, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 3 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 3; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp0 = LEFT_SHIFT(tmp0, CONST_BITS);
    tmp2 = (JLONG)wsptr[2];
    tmp12 = MULTIPLY(tmp2, FIX(0.707106781)); /* c2 */
    tmp10 = tmp0 + tmp12;
    tmp2 = tmp0 - tmp12 - tmp12;

    /* Odd part */

    tmp12 = (JLONG)wsptr[1];
    tmp0 = MULTIPLY(tmp12, FIX(1.224744871)); /* c1 */

    /* Final output stage */

    outptr[0] = range_limit[(int)RIGHT_SHIFT(tmp10 + tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[2] = range_limit[(int)RIGHT_SHIFT(tmp10 - tmp0,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];
    outptr[1] = range_limit[(int)RIGHT_SHIFT(tmp2,
                                             CONST_BITS + PASS1_BITS + 3) &
                            RANGE_MASK];

    wsptr += 3;         /* advance pointer to next row */
  }
}